

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

void Image_Function_Helper::Transpose(TransposeForm4 transpose,Image *in,Image *out)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  (*transpose)(in,0,0,out,0,0,in->_width,in->_height);
  return;
}

Assistant:

void Transpose( FunctionTable::TransposeForm4 transpose,
                    const Image & in, Image & out )
    {
        Image_Function::ParameterValidation( in );
        Image_Function::ParameterValidation( out );

        transpose( in, 0, 0, out, 0, 0, in.width(), in.height() );
    }